

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

DSPOMDP * __thiscall MyPlanner::InitializeModel(MyPlanner *this,Option *options)

{
  char *__s;
  Option *pOVar1;
  RegDemo *this_00;
  allocator<char> local_71;
  string local_70;
  undefined1 local_49;
  RegDemo *local_48;
  undefined1 local_29;
  RegDemo *local_28;
  DSPOMDP *model;
  Option *options_local;
  MyPlanner *this_local;
  
  model = (DSPOMDP *)options;
  options_local = (Option *)this;
  pOVar1 = despot::option::Option::operator_cast_to_Option_(options + 0x60);
  local_29 = 0;
  local_49 = 0;
  if (pOVar1 == (Option *)0x0) {
    this_00 = (RegDemo *)operator_new(0x110);
    local_29 = 1;
    local_28 = this_00;
    despot::RegDemo::RegDemo(this_00);
  }
  else {
    this_00 = (RegDemo *)operator_new(0x110);
    local_49 = 1;
    __s = *(char **)(model + 0x80);
    local_48 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
    despot::RegDemo::RegDemo(this_00,&local_70);
    local_49 = 0;
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return &this_00->super_DSPOMDP;
}

Assistant:

DSPOMDP* InitializeModel(option::Option* options) {
    DSPOMDP* model = !options[E_PARAMS_FILE] ?
      new RegDemo() : new RegDemo(options[E_PARAMS_FILE].arg);
    return model;
  }